

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O0

void Io_WriteBook(Abc_Ntk_t *pNtk,char *FileName)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *__dest;
  char *pcVar4;
  FILE *pFVar5;
  FILE *pFVar6;
  FILE *pFVar7;
  Abc_Ntk_t *pAVar8;
  int local_6c;
  int i;
  Abc_Ntk_t *pNtkTemp;
  Abc_Ntk_t *pExdc;
  uint coreCellArea;
  char *FileExt;
  FILE *pFileWts;
  FILE *pFilePl;
  FILE *pFileScl;
  FILE *pFileAux;
  FILE *pFileNets;
  FILE *pFileNodes;
  char *FileName_local;
  Abc_Ntk_t *pNtk_local;
  
  sVar3 = strlen(FileName);
  __dest = (char *)calloc(sVar3 + 7,1);
  iVar1 = Abc_NtkIsNetlist(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBook.c"
                  ,0x6e,"void Io_WriteBook(Abc_Ntk_t *, char *)");
  }
  strcpy(__dest,FileName);
  pcVar4 = strcat(__dest,".nodes");
  pFVar5 = fopen(pcVar4,"w");
  strcpy(__dest,FileName);
  pcVar4 = strcat(__dest,".nets");
  pFVar6 = fopen(pcVar4,"w");
  strcpy(__dest,FileName);
  pcVar4 = strcat(__dest,".aux");
  pFVar7 = fopen(pcVar4,"w");
  if (((pFVar5 == (FILE *)0x0) || (pFVar6 == (FILE *)0x0)) || (pFVar7 == (FILE *)0x0)) {
    fclose(pFVar7);
    fprintf(_stdout,"Io_WriteBook(): Cannot open the output files.\n");
  }
  else {
    fprintf(pFVar7,"RowBasedPlacement : %s.nodes %s.nets %s.scl %s.pl %s.wts",FileName,FileName,
            FileName,FileName,FileName);
    fclose(pFVar7);
    pExdc._4_4_ = Io_NtkWriteNodes((FILE *)pFVar5,pNtk);
    Io_NtkWriteNets((FILE *)pFVar6,pNtk);
    pAVar8 = Abc_NtkExdc(pNtk);
    if (pAVar8 != (Abc_Ntk_t *)0x0) {
      uVar2 = Io_NtkWriteNodes((FILE *)pFVar5,pNtk);
      pExdc._4_4_ = uVar2 + pExdc._4_4_;
      Io_NtkWriteNets((FILE *)pFVar6,pNtk);
    }
    iVar1 = Abc_NtkWhiteboxNum(pNtk);
    if (iVar1 != 0) {
      __assert_fail("Abc_NtkWhiteboxNum(pNtk) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBook.c"
                    ,0x8f,"void Io_WriteBook(Abc_Ntk_t *, char *)");
    }
    iVar1 = Abc_NtkBlackboxNum(pNtk);
    if (0 < iVar1) {
      for (local_6c = 0; iVar1 = Vec_PtrSize(pNtk->pDesign->vModules), local_6c < iVar1;
          local_6c = local_6c + 1) {
        pAVar8 = (Abc_Ntk_t *)Vec_PtrEntry(pNtk->pDesign->vModules,local_6c);
        if (pAVar8 != pNtk) {
          uVar2 = Io_NtkWriteNodes((FILE *)pFVar5,pAVar8);
          pExdc._4_4_ = uVar2 + pExdc._4_4_;
          Io_NtkWriteNets((FILE *)pFVar6,pAVar8);
        }
      }
    }
    fclose(pFVar5);
    fclose(pFVar6);
    strcpy(__dest,FileName);
    pcVar4 = strcat(__dest,".scl");
    pFVar5 = fopen(pcVar4,"w");
    strcpy(__dest,FileName);
    pcVar4 = strcat(__dest,".pl");
    pFVar6 = fopen(pcVar4,"w");
    strcpy(__dest,FileName);
    pcVar4 = strcat(__dest,".wts");
    pFVar7 = fopen(pcVar4,"w");
    if (__dest != (char *)0x0) {
      free(__dest);
    }
    Io_NtkBuildLayout((FILE *)pFVar5,(FILE *)pFVar6,pNtk,1.0,10.0,pExdc._4_4_);
    fclose(pFVar5);
    fclose(pFVar6);
    fclose(pFVar7);
  }
  return;
}

Assistant:

void Io_WriteBook( Abc_Ntk_t * pNtk, char * FileName )
{

    FILE * pFileNodes, * pFileNets, * pFileAux;
    FILE * pFileScl, * pFilePl, * pFileWts;
    char * FileExt = ABC_CALLOC( char, strlen(FileName)+7 );
    unsigned coreCellArea=0;
    Abc_Ntk_t * pExdc, * pNtkTemp;
    int i;

    assert( Abc_NtkIsNetlist(pNtk) );
    // start writing the files
    strcpy(FileExt, FileName);
    pFileNodes = fopen( strcat(FileExt,".nodes"), "w" );
    strcpy(FileExt, FileName);
    pFileNets  = fopen( strcat(FileExt,".nets"), "w" );
    strcpy(FileExt, FileName);
    pFileAux   = fopen( strcat(FileExt,".aux"), "w" );

        // write the aux file
    if ( (pFileNodes == NULL) || (pFileNets == NULL) || (pFileAux == NULL) )
    {
        fclose( pFileAux );
        fprintf( stdout, "Io_WriteBook(): Cannot open the output files.\n" );
        return;
    }
    fprintf( pFileAux, "RowBasedPlacement : %s.nodes %s.nets %s.scl %s.pl %s.wts", 
         FileName, FileName, FileName, FileName, FileName );
    fclose( pFileAux );

    // write the master network
    coreCellArea+=Io_NtkWriteNodes( pFileNodes, pNtk );
    Io_NtkWriteNets( pFileNets, pNtk );

    // write EXDC network if it exists
    pExdc = Abc_NtkExdc( pNtk );
    if ( pExdc )
    {
    coreCellArea+=Io_NtkWriteNodes( pFileNodes, pNtk );
        Io_NtkWriteNets( pFileNets, pNtk );
    }

    // make sure there is no logic hierarchy
    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );

    // write the hierarchy if present
    if ( Abc_NtkBlackboxNum(pNtk) > 0 )
    {
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pNtkTemp, i )
        {
            if ( pNtkTemp == pNtk )
                continue;
            coreCellArea+=Io_NtkWriteNodes( pFileNodes, pNtkTemp );
            Io_NtkWriteNets( pFileNets, pNtkTemp );
        }
    }
    fclose( pFileNodes );
    fclose( pFileNets );

    strcpy(FileExt, FileName);
    pFileScl = fopen( strcat(FileExt,".scl"), "w" );
    strcpy(FileExt, FileName);
    pFilePl  = fopen( strcat(FileExt,".pl"), "w" );
    strcpy(FileExt, FileName);
    pFileWts   = fopen( strcat(FileExt,".wts"), "w" );
    ABC_FREE(FileExt);

    Io_NtkBuildLayout( pFileScl, pFilePl, pNtk, 1.0, 10, coreCellArea );
    fclose( pFileScl );
    fclose( pFilePl );
    fclose( pFileWts );
}